

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

bool ImGui::SFML::Init(Window *window,Vector2f *displaySize,bool loadDefaultFont)

{
  float fVar1;
  long *plVar2;
  long *plVar3;
  bool bVar4;
  pointer *__ptr;
  undefined8 *puVar5;
  ImGuiContext *pIVar6;
  ulong uVar7;
  long *plVar8;
  long *plVar9;
  ImGuiIO *pIVar10;
  Cursor *this;
  uint i;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long *plVar15;
  
  puVar5 = (undefined8 *)operator_new(0x120);
  sf::Texture::Texture((Texture *)(puVar5 + 2));
  puVar5[9] = 0;
  *(undefined8 *)((long)puVar5 + 0xa4) = 0x100000000;
  lVar13 = 0;
  *(undefined2 *)((long)puVar5 + 0xac) = 0;
  puVar5[0x16] = 0x3f000000;
  *(undefined4 *)(puVar5 + 0x17) = 1;
  *(undefined2 *)((long)puVar5 + 0xbc) = 0;
  *(undefined4 *)(puVar5 + 0x18) = 0x3f000000;
  this = (Cursor *)(puVar5 + 0x19);
  do {
    sf::Cursor::Cursor(this);
    lVar13 = lVar13 + -8;
    this = this + 1;
  } while (lVar13 != -0x48);
  *puVar5 = window;
  pIVar6 = CreateContext((ImFontAtlas *)0x0);
  puVar5[1] = pIVar6;
  bVar4 = sf::Window::hasFocus((Window *)*puVar5);
  *(bool *)(puVar5 + 7) = bVar4;
  *(undefined2 *)((long)puVar5 + 0x44) = 0;
  *(undefined1 *)((long)puVar5 + 0x46) = 0;
  *(undefined4 *)((long)puVar5 + 0x39) = 0;
  *(undefined4 *)(puVar5 + 8) = 9;
  uVar11 = 0;
  do {
    bVar4 = sf::Joystick::isConnected(uVar11);
    if (bVar4) goto LAB_00145a48;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 8);
  uVar11 = 8;
LAB_00145a48:
  *(uint *)(puVar5 + 10) = uVar11;
  lVar13 = 0x15;
  do {
    *(undefined4 *)((long)puVar5 + lVar13 * 4) = 0x20;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x29);
  *(undefined1 *)(puVar5 + 0x23) = 0;
  puVar5[0x22] = 0;
  plVar3 = DAT_0022f120;
  plVar2 = (anonymous_namespace)::s_windowContexts;
  if (DAT_0022f120 == DAT_0022f128) {
    if ((long)DAT_0022f120 - (long)(anonymous_namespace)::s_windowContexts == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar14 = (long)DAT_0022f120 - (long)(anonymous_namespace)::s_windowContexts >> 3;
    uVar7 = 1;
    if (DAT_0022f120 != (anonymous_namespace)::s_windowContexts) {
      uVar7 = uVar14;
    }
    uVar12 = uVar7 + uVar14;
    if (0xffffffffffffffe < uVar12) {
      uVar12 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar7,uVar14)) {
      uVar12 = 0xfffffffffffffff;
    }
    if (uVar12 == 0) {
      plVar8 = (long *)0x0;
    }
    else {
      plVar8 = (long *)operator_new(uVar12 * 8);
    }
    plVar8[uVar14] = (long)puVar5;
    plVar15 = plVar8;
    for (plVar9 = plVar2; plVar3 != plVar9; plVar9 = plVar9 + 1) {
      *plVar15 = *plVar9;
      *plVar9 = 0;
      plVar15 = plVar15 + 1;
    }
    if (plVar2 != (long *)0x0) {
      operator_delete(plVar2,(long)DAT_0022f128 - (long)plVar2);
    }
    DAT_0022f128 = plVar8 + uVar12;
    (anonymous_namespace)::s_windowContexts = plVar8;
  }
  else {
    *DAT_0022f120 = (long)puVar5;
    plVar15 = DAT_0022f120;
  }
  DAT_0022f120 = plVar15 + 1;
  (anonymous_namespace)::s_currWindowCtx = *plVar15;
  SetCurrentContext(*(ImGuiContext **)((anonymous_namespace)::s_currWindowCtx + 8));
  pIVar10 = GetIO();
  *(byte *)&pIVar10->BackendFlags = (byte)pIVar10->BackendFlags | 7;
  pIVar10->BackendPlatformName = "imgui_impl_sfml";
  pIVar10->KeyMap[0x200] = 0x3c;
  pIVar10->KeyMap[0x201] = 0x47;
  pIVar10->KeyMap[0x202] = 0x48;
  pIVar10->KeyMap[0x203] = 0x49;
  pIVar10->KeyMap[0x204] = 0x4a;
  pIVar10->KeyMap[0x205] = 0x3d;
  pIVar10->KeyMap[0x206] = 0x3e;
  pIVar10->KeyMap[0x207] = 0x40;
  pIVar10->KeyMap[0x208] = 0x3f;
  pIVar10->KeyMap[0x209] = 0x41;
  pIVar10->KeyMap[0x20a] = 0x42;
  pIVar10->KeyMap[0x20b] = 0x3b;
  pIVar10->KeyMap[0x20c] = 0x39;
  pIVar10->KeyMap[0x20d] = 0x3a;
  pIVar10->KeyMap[0x20e] = 0x24;
  pIVar10->KeyMap[0x222] = 0;
  pIVar10->KeyMap[0x224] = 2;
  pIVar10->KeyMap[0x237] = 0x15;
  pIVar10->KeyMap[0x239] = 0x17;
  pIVar10->KeyMap[0x23a] = 0x18;
  pIVar10->KeyMap[0x23b] = 0x19;
  uVar11 = 0;
  do {
    bVar4 = sf::Joystick::isConnected(uVar11);
    lVar13 = (anonymous_namespace)::s_currWindowCtx;
    if (bVar4) goto LAB_00145c37;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 8);
  uVar11 = 8;
LAB_00145c37:
  *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) = uVar11;
  if (lVar13 == 0) {
    __assert_fail("s_currWindowCtx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x262,"void ImGui::SFML::SetJoystickMapping(int, unsigned int)");
  }
  *(undefined8 *)(lVar13 + 0x54) = 0x100000000;
  *(undefined8 *)(lVar13 + 0x5c) = 0x200000003;
  *(undefined8 *)(lVar13 + 0x84) = 0x500000004;
  *(undefined8 *)(lVar13 + 0x8c) = 0x500000004;
  *(undefined8 *)(lVar13 + 0xa4) = 0x700000006;
  *(undefined2 *)(lVar13 + 0xac) = 0;
  *(undefined2 *)(lVar13 + 0xbc) = 0;
  *(undefined4 *)(lVar13 + 0xb8) = 1;
  *(undefined8 *)(lVar13 + 0xb0) = 0x40a00000;
  *(undefined4 *)(lVar13 + 0xc0) = 0x40a00000;
  fVar1 = displaySize->y;
  (pIVar10->DisplaySize).x = displaySize->x;
  (pIVar10->DisplaySize).y = fVar1;
  pIVar10->SetClipboardTextFn = anon_unknown.dwarf_130114::setClipboardText;
  pIVar10->GetClipboardTextFn = anon_unknown.dwarf_130114::getClipboardText;
  bVar4 = sf::Cursor::loadFromSystem((Cursor *)(lVar13 + 200),Arrow);
  lVar13 = (anonymous_namespace)::s_currWindowCtx;
  *(bool *)((anonymous_namespace)::s_currWindowCtx + 0x110) = bVar4;
  bVar4 = sf::Cursor::loadFromSystem((Cursor *)(lVar13 + 0xd0),Text);
  lVar13 = (anonymous_namespace)::s_currWindowCtx;
  *(bool *)((anonymous_namespace)::s_currWindowCtx + 0x111) = bVar4;
  bVar4 = sf::Cursor::loadFromSystem((Cursor *)(lVar13 + 0xd8),SizeAll);
  lVar13 = (anonymous_namespace)::s_currWindowCtx;
  *(bool *)((anonymous_namespace)::s_currWindowCtx + 0x112) = bVar4;
  bVar4 = sf::Cursor::loadFromSystem((Cursor *)(lVar13 + 0xe0),SizeVertical);
  lVar13 = (anonymous_namespace)::s_currWindowCtx;
  *(bool *)((anonymous_namespace)::s_currWindowCtx + 0x113) = bVar4;
  bVar4 = sf::Cursor::loadFromSystem((Cursor *)(lVar13 + 0xe8),SizeHorizontal);
  lVar13 = (anonymous_namespace)::s_currWindowCtx;
  *(bool *)((anonymous_namespace)::s_currWindowCtx + 0x114) = bVar4;
  bVar4 = sf::Cursor::loadFromSystem((Cursor *)(lVar13 + 0xf0),SizeBottomLeftTopRight);
  lVar13 = (anonymous_namespace)::s_currWindowCtx;
  *(bool *)((anonymous_namespace)::s_currWindowCtx + 0x115) = bVar4;
  bVar4 = sf::Cursor::loadFromSystem((Cursor *)(lVar13 + 0xf8),SizeTopLeftBottomRight);
  lVar13 = (anonymous_namespace)::s_currWindowCtx;
  *(bool *)((anonymous_namespace)::s_currWindowCtx + 0x116) = bVar4;
  bVar4 = sf::Cursor::loadFromSystem((Cursor *)(lVar13 + 0x100),Hand);
  *(bool *)((anonymous_namespace)::s_currWindowCtx + 0x117) = bVar4;
  if (loadDefaultFont) {
    bVar4 = UpdateFontTexture();
    return bVar4;
  }
  return true;
}

Assistant:

bool Init(sf::Window& window, const sf::Vector2f& displaySize, bool loadDefaultFont) {
#if __cplusplus < 201103L // runtime assert when using earlier than C++11 as no
                          // static_assert support
    assert(sizeof(GLuint) <= sizeof(ImTextureID)); // ImTextureID is not large enough to fit
                                                   // GLuint.
#endif

    s_windowContexts.emplace_back(new WindowContext(&window));

    s_currWindowCtx = s_windowContexts.back().get();
    ImGui::SetCurrentContext(s_currWindowCtx->imContext);

    ImGuiIO& io = ImGui::GetIO();

    // tell ImGui which features we support
    io.BackendFlags |= ImGuiBackendFlags_HasGamepad;
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;
    io.BackendPlatformName = "imgui_impl_sfml";

    // init keyboard mapping
    io.KeyMap[ImGuiKey_Tab] = sf::Keyboard::Tab;
    io.KeyMap[ImGuiKey_LeftArrow] = sf::Keyboard::Left;
    io.KeyMap[ImGuiKey_RightArrow] = sf::Keyboard::Right;
    io.KeyMap[ImGuiKey_UpArrow] = sf::Keyboard::Up;
    io.KeyMap[ImGuiKey_DownArrow] = sf::Keyboard::Down;
    io.KeyMap[ImGuiKey_PageUp] = sf::Keyboard::PageUp;
    io.KeyMap[ImGuiKey_PageDown] = sf::Keyboard::PageDown;
    io.KeyMap[ImGuiKey_Home] = sf::Keyboard::Home;
    io.KeyMap[ImGuiKey_End] = sf::Keyboard::End;
    io.KeyMap[ImGuiKey_Insert] = sf::Keyboard::Insert;
    io.KeyMap[ImGuiKey_Delete] = sf::Keyboard::Delete;
    io.KeyMap[ImGuiKey_Backspace] = sf::Keyboard::Backspace;
    io.KeyMap[ImGuiKey_Space] = sf::Keyboard::Space;
    io.KeyMap[ImGuiKey_Enter] = sf::Keyboard::Enter;
    io.KeyMap[ImGuiKey_Escape] = sf::Keyboard::Escape;
    io.KeyMap[ImGuiKey_A] = sf::Keyboard::A;
    io.KeyMap[ImGuiKey_C] = sf::Keyboard::C;
    io.KeyMap[ImGuiKey_V] = sf::Keyboard::V;
    io.KeyMap[ImGuiKey_X] = sf::Keyboard::X;
    io.KeyMap[ImGuiKey_Y] = sf::Keyboard::Y;
    io.KeyMap[ImGuiKey_Z] = sf::Keyboard::Z;

    s_currWindowCtx->joystickId = getConnectedJoystickId();

    initDefaultJoystickMapping();

    // init rendering
    io.DisplaySize = ImVec2(displaySize.x, displaySize.y);

    // clipboard
    io.SetClipboardTextFn = setClipboardText;
    io.GetClipboardTextFn = getClipboardText;

    // load mouse cursors
    loadMouseCursor(ImGuiMouseCursor_Arrow, sf::Cursor::Arrow);
    loadMouseCursor(ImGuiMouseCursor_TextInput, sf::Cursor::Text);
    loadMouseCursor(ImGuiMouseCursor_ResizeAll, sf::Cursor::SizeAll);
    loadMouseCursor(ImGuiMouseCursor_ResizeNS, sf::Cursor::SizeVertical);
    loadMouseCursor(ImGuiMouseCursor_ResizeEW, sf::Cursor::SizeHorizontal);
    loadMouseCursor(ImGuiMouseCursor_ResizeNESW, sf::Cursor::SizeBottomLeftTopRight);
    loadMouseCursor(ImGuiMouseCursor_ResizeNWSE, sf::Cursor::SizeTopLeftBottomRight);
    loadMouseCursor(ImGuiMouseCursor_Hand, sf::Cursor::Hand);

    if (loadDefaultFont) {
        // this will load default font automatically
        // No need to call AddDefaultFont
        return UpdateFontTexture();
    }

    return true;
}